

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LPO.cpp
# Opt level: O1

Result __thiscall Kernel::LPO::cMA(LPO *this,AppliedTerm s,AppliedTerm t,TermList *tl,uint arity)

{
  AppliedTerm tl2;
  int iVar1;
  Result RVar2;
  undefined4 extraout_var;
  undefined1 uVar4;
  TermList *sl;
  ulong uVar5;
  undefined7 uStack_3f;
  ulong uVar3;
  
  if (arity != 0) {
    sl = tl + -1;
    uVar5 = 0;
    do {
      uVar3 = sl[1]._content;
      uVar4 = t.aboveVar;
      if ((((undefined1  [24])t & (undefined1  [24])0x1) != (undefined1  [24])0x0) &&
         ((uVar3 & 1) != 0)) {
        iVar1 = (*(t.applicator)->_vptr_SubstApplicator[2])(t.applicator,uVar3 >> 2 & 0xffffffff);
        uVar3 = CONCAT44(extraout_var,iVar1);
        uVar4 = 0;
      }
      tl2._9_7_ = uStack_3f;
      tl2.aboveVar = (bool)uVar4;
      tl2.term._content = uVar3;
      tl2.applicator = t.applicator;
      RVar2 = clpo(this,s,tl2);
      if (RVar2 != GREATER) {
        if (1 < RVar2 - LESS) {
          RVar2 = alpha(this,sl,~(uint)uVar5 + arity,t,s);
          return *(Result *)(&DAT_008f694c + (long)(int)RVar2 * 4);
        }
        return LESS;
      }
      uVar5 = uVar5 + 1;
      sl = sl + -1;
    } while (arity != uVar5);
  }
  return GREATER;
}

Assistant:

Ordering::Result LPO::cMA(AppliedTerm s, AppliedTerm t, const TermList* tl, unsigned arity) const
{
  for (unsigned i = 0; i < arity; i++) {
    switch(clpo(s, AppliedTerm(*(tl - i),t))) {
    case EQUAL:
    case LESS:
      return LESS;
    case INCOMPARABLE:
      return reverse(alpha(tl - i - 1, arity - i - 1, t, s));
    case GREATER:
      break;
    default:
      ASSERTION_VIOLATION;
    }
  }
  return GREATER;
}